

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O3

char * lj_strfmt_wint(char *p,int32_t k)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  char cVar4;
  uint32_t u;
  uint uVar5;
  uint uVar6;
  
  if (k < 0) {
    k = -k;
    *p = '-';
    p = p + 1;
  }
  if ((uint)k < 10000) {
    if ((uint)k < 10) goto LAB_0010ee40;
    if (99 < (uint)k) {
      if (999 < (uint)k) goto LAB_0010edf9;
      goto LAB_0010ee12;
    }
  }
  else {
    cVar4 = (char)((ulong)(uint)k / 10000);
    uVar3 = (uint)k / 10000;
    uVar6 = (uint)k / 10000;
    if ((uint)k < 100000000) {
      if (99999 < (uint)k) {
        if (999999 < (uint)k) {
          if (9999999 < (uint)k) goto LAB_0010ed97;
          goto LAB_0010edb7;
        }
        goto LAB_0010edd4;
      }
    }
    else {
      cVar4 = (char)((ulong)(uint)k / 100000000);
      if (999999999 < (uint)k) {
        bVar1 = (byte)(((uint)k / 100000000) / 10);
        cVar4 = (char)((uint)k / 100000000) + bVar1 * -10;
        *p = bVar1 | 0x30;
        p = (char *)((byte *)p + 1);
      }
      uVar6 = ((uint)k / 100000000) * -10000 + (uint)k / 10000;
      *p = cVar4 + 0x30;
      p = (char *)((byte *)p + 1);
LAB_0010ed97:
      uVar5 = uVar6 * 0x20c5 >> 0x17;
      uVar3 = uVar5 * -1000 + uVar6;
      *p = (char)uVar5 + 0x30;
      p = (char *)((byte *)p + 1);
LAB_0010edb7:
      uVar5 = uVar3 * 0x29 >> 0xc;
      uVar6 = uVar5 * -100 + uVar3;
      *p = (char)uVar5 + 0x30;
      p = (char *)((byte *)p + 1);
LAB_0010edd4:
      cVar2 = (char)(uVar6 * 0x67 >> 10);
      cVar4 = (char)uVar6 + cVar2 * -10;
      *p = cVar2 + 0x30;
      p = (char *)((byte *)p + 1);
    }
    k = (uint)k % 10000;
    *p = cVar4 + 0x30;
    p = (char *)((byte *)p + 1);
LAB_0010edf9:
    uVar3 = (uint)(k * 0x20c5) >> 0x17;
    k = k + uVar3 * -1000;
    *p = (char)uVar3 + 0x30;
    p = (char *)((byte *)p + 1);
LAB_0010ee12:
    uVar3 = (uint)(k * 0x29) >> 0xc;
    k = uVar3 * -100 + k;
    *p = (char)uVar3 + 0x30;
    p = (char *)((byte *)p + 1);
  }
  uVar3 = (uint)(k * 0x67) >> 10;
  k = k + uVar3 * -10;
  *p = (char)uVar3 + 0x30;
  p = (char *)((byte *)p + 1);
LAB_0010ee40:
  *p = (char)k + 0x30;
  return (char *)((byte *)p + 1);
}

Assistant:

char * LJ_FASTCALL lj_strfmt_wint(char *p, int32_t k)
{
  uint32_t u = (uint32_t)k;
  if (k < 0) { u = (uint32_t)-k; *p++ = '-'; }
  if (u < 10000) {
    if (u < 10) goto dig1;
    if (u < 100) goto dig2;
    if (u < 1000) goto dig3;
  } else {
    uint32_t v = u / 10000; u -= v * 10000;
    if (v < 10000) {
      if (v < 10) goto dig5;
      if (v < 100) goto dig6;
      if (v < 1000) goto dig7;
    } else {
      uint32_t w = v / 10000; v -= w * 10000;
      if (w >= 10) WINT_R(w, 10, 10)
      *p++ = (char)('0'+w);
    }
    WINT_R(v, 23, 1000)
    dig7: WINT_R(v, 12, 100)
    dig6: WINT_R(v, 10, 10)
    dig5: *p++ = (char)('0'+v);
  }
  WINT_R(u, 23, 1000)
  dig3: WINT_R(u, 12, 100)
  dig2: WINT_R(u, 10, 10)
  dig1: *p++ = (char)('0'+u);
  return p;
}